

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *pvVar1;
  cmSourceFile *this_00;
  cmLocalGenerator *this_01;
  pointer this_02;
  bool bVar2;
  reference config;
  reference pbVar3;
  reference ppcVar4;
  ostream *poVar5;
  string *psVar6;
  string local_2e0;
  string local_2c0 [32];
  undefined1 local_2a0 [8];
  ostringstream e;
  cmSourceFile *f_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3_1;
  string thisConfigFiles;
  cmSourceFile *f;
  iterator __end3;
  iterator __begin3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  char *sep;
  string firstConfigFiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string *firstConfig;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  const_iterator it;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_local;
  cmGeneratorTarget *this_local;
  
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)files;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  cmMakefile::GetConfigurations
            (&local_58,this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,true);
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38);
  }
  firstConfig = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_70,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&firstConfig);
  config = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_70);
  GetSourceFilesWithoutObjectLibraries
            (this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                  configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,config);
  while( true ) {
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38);
    bVar2 = __gnu_cxx::operator!=
                      (&local_70,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&configFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             ((long)&firstConfigFiles.field_2 + 8);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(pvVar1);
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_70);
    GetSourceFilesWithoutObjectLibraries(this,pvVar1,pbVar3);
    bVar2 = std::operator!=((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            ((long)&firstConfigFiles.field_2 + 8),
                            (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      std::__cxx11::string::string((string *)&sep);
      this_02 = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0x8b64e0;
      __end3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                          configs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      f = (cmSourceFile *)
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_02);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                         *)&f), bVar2) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end3);
        thisConfigFiles.field_2._8_8_ = *ppcVar4;
        std::__cxx11::string::operator+=((string *)&sep,(char *)__range3);
        psVar6 = cmSourceFile::GetFullPath
                           ((cmSourceFile *)thisConfigFiles.field_2._8_8_,(string *)0x0);
        std::__cxx11::string::operator+=((string *)&sep,(string *)psVar6);
        __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0x89f2a7;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::string((string *)&__range3_1);
      __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0x8b64e0;
      pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               ((long)&firstConfigFiles.field_2 + 8);
      __end3_1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pvVar1);
      f_1 = (cmSourceFile *)
            std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pvVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                 *)&f_1), bVar2) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end3_1);
        this_00 = *ppcVar4;
        std::__cxx11::string::operator+=((string *)&__range3_1,(char *)__range3);
        psVar6 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        std::__cxx11::string::operator+=((string *)&__range3_1,(string *)psVar6);
        __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0x89f2a7;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3_1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      poVar5 = std::operator<<((ostream *)local_2a0,"Target \"");
      psVar6 = GetName_abi_cxx11_(this);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,
                               "\" has source files which vary by configuration. This is not supported by the \""
                              );
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_2c0);
      poVar5 = std::operator<<(poVar5,local_2c0);
      poVar5 = std::operator<<(poVar5,"\" generator.\nConfig \"");
      poVar5 = std::operator<<(poVar5,(string *)config);
      poVar5 = std::operator<<(poVar5,"\":\n  ");
      poVar5 = std::operator<<(poVar5,(string *)&sep);
      poVar5 = std::operator<<(poVar5,"\nConfig \"");
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_70);
      poVar5 = std::operator<<(poVar5,(string *)pbVar3);
      poVar5 = std::operator<<(poVar5,"\":\n  ");
      poVar5 = std::operator<<(poVar5,(string *)&__range3_1);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string(local_2c0);
      this_01 = this->LocalGenerator;
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(this_01,FATAL_ERROR,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      this_local._7_1_ = 0;
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::__cxx11::string::~string((string *)&__range3_1);
      std::__cxx11::string::~string((string *)&sep);
    }
    else {
      bVar2 = false;
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               ((long)&firstConfigFiles.field_2 + 8));
    if (bVar2) goto LAB_00496f89;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_70);
  }
  this_local._7_1_ = 1;
LAB_00496f89:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.emplace_back();
  }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}